

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

void glist_checkanddeselectall(_glist *gl,t_gobj *g)

{
  _glist *gl_00;
  
  if ((gl->gl_obj).te_g.g_pd != canvas_class) {
    return;
  }
  for (gl_00 = (_glist *)gl->gl_list; gl_00 != (_glist *)0x0;
      gl_00 = (_glist *)(gl_00->gl_obj).te_g.g_next) {
    glist_checkanddeselectall(gl_00,g);
  }
  glist_noselect(gl);
  return;
}

Assistant:

static void glist_checkanddeselectall(t_glist *gl, t_gobj *g)
{
    t_glist *gl2;
    t_gobj *g2;
    if (pd_class(&g->g_pd) != canvas_class)
        return;
    gl2 = (t_glist *)g;
    for (g2 = gl2->gl_list; g2; g2 = g2->g_next)
        glist_checkanddeselectall(gl2, g2);
    glist_noselect(gl2);
}